

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void __thiscall Pathie::Path::Path(Path *this)

{
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  (this->m_path)._M_string_length = 0;
  (this->m_path).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x10f2cf);
  return;
}

Assistant:

Path::Path()
{
  m_path = ".";
}